

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,RandSequenceStatementSyntax *syntax)

{
  pointer ppPVar1;
  size_t sVar2;
  ProductionSyntax *syntax_00;
  SyntaxNode *syntax_01;
  SourceLocation defaultLoc;
  StatementBlockSymbol *pSVar3;
  RandSeqProductionSymbol *symbol;
  long lVar4;
  Scope *this;
  string_view sVar5;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffb0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_48;
  
  defaultLoc = parsing::Token::location(&syntax->randsequence);
  getLabel(&local_48,&syntax->super_StatementSyntax,defaultLoc);
  pSVar3 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)local_48.first._M_len,
                       (string_view)local_48._8_16_,(SourceLocation)0x0,Sequential,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffb0);
  ppPVar1 = (syntax->productions).
            super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>._M_ptr;
  sVar2 = (syntax->productions).
          super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  this = &pSVar3->super_Scope;
  for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    syntax_00 = *(ProductionSyntax **)((long)ppPVar1 + lVar4);
    syntax_01 = (syntax_00->super_SyntaxNode).previewNode;
    if (syntax_01 != (SyntaxNode *)0x0) {
      Scope::addMembers(this,syntax_01);
    }
    sVar5 = parsing::Token::valueText(&syntax_00->name);
    if (sVar5._M_len != 0) {
      symbol = RandSeqProductionSymbol::fromSyntax(scope,syntax_00);
      Scope::addMember(this,&symbol->super_Symbol);
    }
  }
  return pSVar3;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const RandSequenceStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.randsequence.location());
    auto result = createBlock(scope, syntax, name, loc, StatementBlockKind::Sequential,
                              VariableLifetime::Automatic);

    for (auto prod : syntax.productions) {
        if (prod->previewNode)
            result->addMembers(*prod->previewNode);

        if (prod->name.valueText().empty())
            continue;

        auto& symbol = RandSeqProductionSymbol::fromSyntax(scope, *prod);
        result->addMember(symbol);
    }

    return *result;
}